

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O2

void write_bmp_header(j_decompress_ptr cinfo,bmp_dest_ptr dest)

{
  J_COLOR_SPACE JVar1;
  JDIMENSION JVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  byte bVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  uint map_colors;
  bool bVar9;
  undefined2 local_56;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined4 local_50;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined2 local_4a;
  undefined4 local_48;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  JVar1 = cinfo->out_color_space;
  bVar4 = false;
  if (JVar1 == JCS_RGB || JVar1 - JCS_EXT_RGB < 10) {
    bVar9 = cinfo->quantize_colors == 0;
    bVar4 = !bVar9;
    bVar5 = bVar9 << 4 | 8;
    map_colors = (uint)bVar4 << 8;
  }
  else {
    bVar5 = 0x18;
    if (JVar1 == JCS_CMYK) {
      map_colors = 0;
    }
    else {
      map_colors = 0;
      if (JVar1 != JCS_RGB565) {
        map_colors = 0x100;
        bVar4 = true;
        bVar5 = 8;
      }
    }
  }
  lVar8 = (ulong)dest->row_width * (ulong)cinfo->output_height + (ulong)map_colors * 4 + 0x36;
  local_50 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_56 = 0x4d42;
  local_54 = (undefined1)lVar8;
  local_53 = (undefined1)((ulong)lVar8 >> 8);
  local_52 = (undefined1)((ulong)lVar8 >> 0x10);
  local_51 = (undefined1)((ulong)lVar8 >> 0x18);
  local_4c = 0x36;
  local_4b = (undefined1)(map_colors >> 6);
  local_4a = 0;
  JVar2 = cinfo->output_width;
  _local_48 = CONCAT17((char)(JVar2 >> 0x18),
                       CONCAT16((char)(JVar2 >> 0x10),
                                CONCAT15((char)(JVar2 >> 8),CONCAT14((char)JVar2,0x28))));
  uStack_40._0_6_ = (uint6)CONCAT14(1,cinfo->output_height);
  uStack_40 = (ulong)CONCAT16(bVar5,(uint6)uStack_40);
  if (cinfo->density_unit == '\x02') {
    iVar7 = (uint)cinfo->Y_density * 100;
    uStack_30 = (ulong)CONCAT16((char)((uint)iVar7 >> 0x10),
                                CONCAT15((char)((uint)iVar7 >> 8),
                                         CONCAT14((char)iVar7,(uint)cinfo->X_density * 100)));
  }
  local_28 = (ulong)(byte)(map_colors >> 8) << 8;
  sVar6 = fwrite(&local_56,1,0xe,(FILE *)(dest->pub).output_file);
  if (sVar6 != 0xe) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  sVar6 = fwrite(&local_48,1,0x28,(FILE *)(dest->pub).output_file);
  if (sVar6 != 0x28) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (bVar4) {
    write_colormap(cinfo,dest,map_colors,4);
    return;
  }
  return;
}

Assistant:

LOCAL(void)
write_bmp_header(j_decompress_ptr cinfo, bmp_dest_ptr dest)
/* Write a Windows-style BMP file header, including colormap if needed */
{
  char bmpfileheader[14];
  char bmpinfoheader[40];

#define PUT_2B(array, offset, value) \
  (array[offset] = (char)((value) & 0xFF), \
   array[offset + 1] = (char)(((value) >> 8) & 0xFF))
#define PUT_4B(array, offset, value) \
  (array[offset] = (char)((value) & 0xFF), \
   array[offset + 1] = (char)(((value) >> 8) & 0xFF), \
   array[offset + 2] = (char)(((value) >> 16) & 0xFF), \
   array[offset + 3] = (char)(((value) >> 24) & 0xFF))

  long headersize, bfSize;
  int bits_per_pixel, cmap_entries;

  /* Compute colormap size and total file size */
  if (IsExtRGB(cinfo->out_color_space)) {
    if (cinfo->quantize_colors) {
      /* Colormapped RGB */
      bits_per_pixel = 8;
      cmap_entries = 256;
    } else {
      /* Unquantized, full color RGB */
      bits_per_pixel = 24;
      cmap_entries = 0;
    }
  } else if (cinfo->out_color_space == JCS_RGB565 ||
             cinfo->out_color_space == JCS_CMYK) {
    bits_per_pixel = 24;
    cmap_entries   = 0;
  } else {
    /* Grayscale output.  We need to fake a 256-entry colormap. */
    bits_per_pixel = 8;
    cmap_entries = 256;
  }
  /* File size */
  headersize = 14 + 40 + cmap_entries * 4; /* Header and colormap */
  bfSize = headersize + (long)dest->row_width * (long)cinfo->output_height;

  /* Set unused fields of header to 0 */
  MEMZERO(bmpfileheader, sizeof(bmpfileheader));
  MEMZERO(bmpinfoheader, sizeof(bmpinfoheader));

  /* Fill the file header */
  bmpfileheader[0] = 0x42;      /* first 2 bytes are ASCII 'B', 'M' */
  bmpfileheader[1] = 0x4D;
  PUT_4B(bmpfileheader, 2, bfSize); /* bfSize */
  /* we leave bfReserved1 & bfReserved2 = 0 */
  PUT_4B(bmpfileheader, 10, headersize); /* bfOffBits */

  /* Fill the info header (Microsoft calls this a BITMAPINFOHEADER) */
  PUT_2B(bmpinfoheader, 0, 40); /* biSize */
  PUT_4B(bmpinfoheader, 4, cinfo->output_width); /* biWidth */
  PUT_4B(bmpinfoheader, 8, cinfo->output_height); /* biHeight */
  PUT_2B(bmpinfoheader, 12, 1); /* biPlanes - must be 1 */
  PUT_2B(bmpinfoheader, 14, bits_per_pixel); /* biBitCount */
  /* we leave biCompression = 0, for none */
  /* we leave biSizeImage = 0; this is correct for uncompressed data */
  if (cinfo->density_unit == 2) { /* if have density in dots/cm, then */
    PUT_4B(bmpinfoheader, 24, (long)(cinfo->X_density * 100)); /* XPels/M */
    PUT_4B(bmpinfoheader, 28, (long)(cinfo->Y_density * 100)); /* XPels/M */
  }
  PUT_2B(bmpinfoheader, 32, cmap_entries); /* biClrUsed */
  /* we leave biClrImportant = 0 */

  if (JFWRITE(dest->pub.output_file, bmpfileheader, 14) != (size_t)14)
    ERREXIT(cinfo, JERR_FILE_WRITE);
  if (JFWRITE(dest->pub.output_file, bmpinfoheader, 40) != (size_t)40)
    ERREXIT(cinfo, JERR_FILE_WRITE);

  if (cmap_entries > 0)
    write_colormap(cinfo, dest, cmap_entries, 4);
}